

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

KeyData * __thiscall
cfd::core::Psbt::GetTxOutKeyData
          (KeyData *__return_storage_ptr__,Psbt *this,uint32_t index,bool ignore_error)

{
  CfdException *this_00;
  allocator local_51;
  undefined1 local_50 [32];
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> arr;
  
  GetTxOutKeyDataList(&arr,this,index);
  if (arr.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      arr.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_start) {
    if (!ignore_error) {
      local_50._0_8_ = "cfdcore_psbt.cpp";
      local_50._8_4_ = 0xc0b;
      local_50._16_8_ = "GetTxOutKeyData";
      logger::warn<>((CfdSourceLocation *)local_50,"key not found.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)local_50,"psbt key not found error.",&local_51);
      CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_50);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    KeyData::KeyData(__return_storage_ptr__);
  }
  else {
    KeyData::KeyData(__return_storage_ptr__,
                     arr.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&arr);
  return __return_storage_ptr__;
}

Assistant:

KeyData Psbt::GetTxOutKeyData(uint32_t index, bool ignore_error) const {
  auto arr = GetTxOutKeyDataList(index);
  if (arr.size() > 0) {
    return arr[0];
  } else if (ignore_error) {
    return KeyData();
  } else {
    warn(CFD_LOG_SOURCE, "key not found.");
    throw CfdException(kCfdIllegalStateError, "psbt key not found error.");
  }
}